

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NumberParser.cpp
# Opt level: O3

IntResult * __thiscall
slang::parsing::NumberParser::reportMissingDigits
          (IntResult *__return_storage_ptr__,NumberParser *this,Token sizeToken,Token baseToken,
          Token first)

{
  SourceLocation SVar1;
  undefined8 uVar2;
  string_view sVar3;
  Token TVar4;
  Token local_58;
  Token local_48;
  
  local_58.info = baseToken.info;
  local_58._0_8_ = baseToken._0_8_;
  uVar2 = sizeToken._0_8_;
  if ((first.info == (Info *)0x0) || (first.kind == EndOfFile)) {
    SVar1 = Token::location(&local_58);
    sVar3 = Token::rawText(&local_58);
    SVar1 = (SourceLocation)(sVar3._M_len * 0x10000000 + (long)SVar1);
  }
  else {
    SVar1 = Token::location(&first);
  }
  Diagnostics::add(this->diagnostics,(DiagCode)0x3,SVar1);
  local_48.kind = local_58.kind;
  local_48._2_1_ = local_58._2_1_;
  local_48.numFlags.raw = local_58.numFlags.raw;
  local_48.rawLen = local_58.rawLen;
  local_48.info = local_58.info;
  TVar4 = Token::createMissing(this->alloc,IntegerLiteral,SVar1);
  (__return_storage_ptr__->size).kind = (short)uVar2;
  (__return_storage_ptr__->size).field_0x2 = (char)((ulong)uVar2 >> 0x10);
  (__return_storage_ptr__->size).numFlags = (NumericTokenFlags)(char)((ulong)uVar2 >> 0x18);
  (__return_storage_ptr__->size).rawLen = (int)((ulong)uVar2 >> 0x20);
  (__return_storage_ptr__->size).info = sizeToken.info;
  (__return_storage_ptr__->base).kind = local_48.kind;
  (__return_storage_ptr__->base).field_0x2 = local_48._2_1_;
  (__return_storage_ptr__->base).numFlags = (NumericTokenFlags)local_48.numFlags.raw;
  (__return_storage_ptr__->base).rawLen = local_48.rawLen;
  (__return_storage_ptr__->base).info = local_48.info;
  __return_storage_ptr__->value = TVar4;
  __return_storage_ptr__->isSimple = false;
  return __return_storage_ptr__;
}

Assistant:

NumberParser::IntResult NumberParser::reportMissingDigits(Token sizeToken, Token baseToken,
                                                          Token first) {
    // If we issued this error in response to seeing an EOF token, back up and put
    // the error on the last consumed token instead.
    SourceLocation errLoc;
    if (first && first.kind != TokenKind::EndOfFile)
        errLoc = first.location();
    else
        errLoc = baseToken.location() + baseToken.rawText().size();

    addDiag(diag::ExpectedVectorDigits, errLoc);
    return IntResult::vector(sizeToken, baseToken,
                             Token::createMissing(alloc, TokenKind::IntegerLiteral, errLoc));
}